

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char16_t * u16tou16_path(char16_t *source,char16_t *dest)

{
  size_t sVar1;
  char16_t *in_RSI;
  char16_t *in_RDI;
  int size;
  undefined8 local_8;
  
  if ((in_RSI == (char16_t *)0x0) || (in_RDI == (char16_t *)0x0)) {
    g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
    local_8 = (char16_t *)0x0;
  }
  else {
    sVar1 = strlenU16(in_RDI);
    if ((int)sVar1 < 0x104) {
      local_8 = strcpyU16(in_RSI,in_RDI);
    }
    else {
      g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
      local_8 = (char16_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

char16_t *u16tou16_path(const char16_t *source, char16_t *dest)
{
	if (dest == NULL || source == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	int size = strlenU16(source);
	if (size >= MAX_PATH)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	return strcpyU16(dest, source);
}